

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O2

int mbedtls_ssl_handshake_server_step(mbedtls_ssl_context *ssl)

{
  uchar *buf;
  int *minor;
  byte *buf_00;
  uint uVar1;
  _func_int_void_ptr_uchar_ptr_ptr_uchar_ptr_uchar_ptr_size_t *p_Var2;
  _func_int_void_ptr_mbedtls_ssl_session_ptr *p_Var3;
  _func_int_void_ptr_uchar_ptr_size_t_uchar_ptr_size_t *p_Var4;
  int *piVar5;
  char cVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  mbedtls_ssl_key_cert *pmVar11;
  byte bVar12;
  uchar uVar13;
  ushort uVar14;
  ushort uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  mbedtls_key_exchange_type_t mVar19;
  mbedtls_md_type_t mVar20;
  mbedtls_pk_type_t mVar21;
  mbedtls_md_type_t mVar22;
  mbedtls_ecp_curve_info **crv;
  mbedtls_pk_context *pmVar23;
  time_t tVar24;
  mbedtls_ecp_group_id *pmVar25;
  mbedtls_ssl_session *pmVar26;
  mbedtls_ssl_ciphersuite_t *pmVar27;
  mbedtls_cipher_info_t *pmVar28;
  mbedtls_ssl_handshake_params *pmVar29;
  size_t sVar30;
  size_t sVar31;
  mbedtls_md_info_t *pmVar32;
  mbedtls_ecp_curve_info **ppmVar33;
  mbedtls_ecp_curve_info *pmVar34;
  int line;
  ulong uVar35;
  mbedtls_ssl_config *pmVar36;
  long lVar37;
  ulong uVar38;
  mbedtls_x509_crt *pmVar39;
  uchar *puVar40;
  ulong uVar41;
  ushort *puVar42;
  mbedtls_ssl_key_cert *pmVar43;
  char *pcVar44;
  uint cli_msg_seq;
  mbedtls_mpi *X;
  ushort *puVar45;
  uchar *puVar46;
  byte *pbVar47;
  uint32_t auVar48 [2];
  long lVar49;
  long lVar50;
  mbedtls_sha1_context *hash_00;
  size_t hash_len;
  ulong uVar51;
  uchar *puVar52;
  ulong uVar53;
  mbedtls_md_type_t *pmVar54;
  bool bVar55;
  size_t sStackY_210;
  undefined8 in_stack_fffffffffffffdf8;
  undefined4 uVar56;
  undefined4 uVar57;
  undefined8 in_stack_fffffffffffffe00;
  uchar *local_1f0;
  ushort *local_1e8;
  mbedtls_ssl_key_cert *local_1e0;
  size_t local_1c0;
  size_t signature_len;
  char *local_1a8;
  ushort *local_1a0;
  size_t len;
  char **local_190;
  ushort *local_188;
  char *local_180;
  byte *local_178;
  ulong local_170;
  mbedtls_sha1_context mbedtls_sha1;
  undefined1 auStack_d0 [8];
  uchar hash [64];
  mbedtls_md5_context mbedtls_md5;
  
  uVar56 = (undefined4)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  iVar17 = -0x7100;
  if (ssl->state == 0x10) {
    return -0x7100;
  }
  if (ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) {
    return -0x7100;
  }
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
             ,0xe14,"server state: %d");
  iVar16 = mbedtls_ssl_flush_output(ssl);
  if (iVar16 != 0) {
    return iVar16;
  }
  if ((((ssl->conf->field_0x164 & 2) != 0) && (ssl->handshake->retransmit_state == '\x01')) &&
     (iVar16 = mbedtls_ssl_resend(ssl), iVar16 != 0)) {
    return iVar16;
  }
  switch(ssl->state) {
  case 0:
    ssl->state = 1;
    return 0;
  case 1:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x414,"=> parse client hello");
    while( true ) {
      if ((ssl->renego_status == 0) && (iVar17 = mbedtls_ssl_fetch_input(ssl,5), iVar17 != 0)) {
        pcVar44 = "mbedtls_ssl_fetch_input";
        iVar16 = 0x424;
        goto LAB_0016dd5a;
      }
      pbVar47 = ssl->in_hdr;
      sVar31 = (ulong)(*(uint *)&ssl->conf->field_0x164 & 2) * 4 + 5;
      mbedtls_debug_print_buf
                (ssl,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x433,"record header",pbVar47,sVar31);
      uVar56 = (undefined4)(sVar31 >> 0x20);
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x43f,"client hello v3, message type: %d",(ulong)*pbVar47);
      if (*pbVar47 != 0x16) {
        iVar17 = 0x443;
        goto LAB_0016e9c7;
      }
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x448,"client hello v3, message len.: %d",
                 (ulong)(ushort)(*(ushort *)ssl->in_len << 8 | *(ushort *)ssl->in_len >> 8));
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,1099,"client hello v3, protocol version: [%d:%d]",(ulong)pbVar47[1],
                 CONCAT44(uVar56,(uint)pbVar47[2]));
      mbedtls_ssl_read_version
                ((int *)&mbedtls_md5,(int *)hash,*(uint *)&ssl->conf->field_0x164 >> 1 & 1,
                 pbVar47 + 1);
      uVar56 = (undefined4)((ulong)in_stack_fffffffffffffe00 >> 0x20);
      if ((int)mbedtls_md5.total[0] < 3) {
        iVar17 = 0x455;
        goto LAB_0016e9c7;
      }
      if (((ssl->conf->field_0x164 & 2) == 0) || (ssl->renego_status != 0)) goto LAB_0016e2f5;
      puVar52 = ssl->in_ctr;
      if ((*puVar52 != '\0') || (puVar52[1] != '\0')) {
        iVar17 = 0x465;
        goto LAB_0016e9c7;
      }
      puVar40 = ssl->out_ctr;
      *(undefined2 *)(puVar40 + 6) = *(undefined2 *)(puVar52 + 6);
      *(undefined4 *)(puVar40 + 2) = *(undefined4 *)(puVar52 + 2);
      iVar17 = mbedtls_ssl_dtls_replay_check(ssl);
      uVar56 = (undefined4)((ulong)in_stack_fffffffffffffe00 >> 0x20);
      if (iVar17 == 0) break;
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x46e,"replayed record, discarding");
      ssl->next_record_offset = 0;
      ssl->in_left = 0;
    }
    mbedtls_ssl_dtls_replay_update(ssl);
LAB_0016e2f5:
    if (ssl->renego_status == 0) {
      uVar14 = *(ushort *)ssl->in_len << 8 | *(ushort *)ssl->in_len >> 8;
      sVar31 = (size_t)uVar14;
      if (0x4000 < uVar14) {
        iVar17 = 0x487;
        goto LAB_0016e9c7;
      }
      iVar17 = mbedtls_ssl_fetch_input
                         (ssl,sVar31 + (ulong)(*(uint *)&ssl->conf->field_0x164 & 2) * 4 + 5);
      if (iVar17 != 0) {
        pcVar44 = "mbedtls_ssl_fetch_input";
        iVar16 = 0x48d;
        goto LAB_0016dd5a;
      }
      if ((ssl->conf->field_0x164 & 2) == 0) {
        ssl->in_left = 0;
      }
      else {
        ssl->next_record_offset = sVar31 + 0xd;
      }
    }
    else {
      sVar31 = ssl->in_hslen;
    }
    pbVar47 = ssl->in_msg;
    uVar53 = sVar31;
    mbedtls_debug_print_buf
              (ssl,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x49c,"record contents",pbVar47,sVar31);
    uVar57 = (undefined4)(uVar53 >> 0x20);
    (*ssl->handshake->update_checksum)(ssl,pbVar47,sVar31);
    if (sVar31 < (ulong)((ssl->conf->field_0x164 & 2) >> 1) * 8 + 4) {
      iVar17 = 0x4aa;
      goto LAB_0016e9c7;
    }
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x4ae,"client hello v3, handshake type: %d",(ulong)*pbVar47);
    if (*pbVar47 != 1) {
      iVar17 = 0x4b2;
      goto LAB_0016e9c7;
    }
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x4b7,"client hello v3, handshake len.: %d",
               (ulong)((uint)pbVar47[3] | (uint)pbVar47[2] << 8 | (uint)pbVar47[1] << 0x10));
    if (pbVar47[1] == 0) {
      pmVar36 = ssl->conf;
      uVar18 = *(uint *)&pmVar36->field_0x164;
      if (sVar31 == (ulong)(ushort)(*(ushort *)(pbVar47 + 2) << 8 | *(ushort *)(pbVar47 + 2) >> 8) +
                    (ulong)(uVar18 & 2) * 4 + 4) {
        if ((uVar18 & 2) == 0) {
          lVar37 = 4;
        }
        else {
          puVar52 = ssl->in_msg;
          uVar14 = *(ushort *)(puVar52 + 4) << 8 | *(ushort *)(puVar52 + 4) >> 8;
          pmVar29 = ssl->handshake;
          uVar18 = (uint)uVar14;
          if (ssl->renego_status == 1) {
            if (uVar18 != pmVar29->in_msg_seq) {
              mbedtls_debug_print_msg
                        (ssl,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                         ,0x4d3,"bad client hello message_seq: %d (expected %d)",(ulong)uVar14,
                         CONCAT44(uVar57,pmVar29->in_msg_seq));
              return -0x7900;
            }
          }
          else {
            pmVar29->out_msg_seq = uVar18;
          }
          pmVar29->in_msg_seq = uVar18 + 1;
          if ((((puVar52[6] != '\0') || (puVar52[7] != '\0')) || (puVar52[8] != '\0')) ||
             (iVar17 = bcmp(puVar52 + 1,puVar52 + 9,3), iVar17 != 0)) {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                       ,0x4e9,"ClientHello fragmentation not supported");
            return -0x7080;
          }
          lVar37 = (ulong)((pmVar36->field_0x164 & 2) >> 1) * 8 + 4;
        }
        uVar53 = sVar31 - lVar37;
        if (uVar53 < 0x26) {
          iVar17 = 0x509;
          goto LAB_0016e9c7;
        }
        buf_00 = pbVar47 + lVar37;
        uVar57 = 0;
        mbedtls_debug_print_buf
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                   ,0x510,"client hello, version",buf_00,2);
        minor = &ssl->minor_ver;
        mbedtls_ssl_read_version
                  (&ssl->major_ver,minor,*(uint *)&ssl->conf->field_0x164 >> 1 & 1,buf_00);
        uVar18 = ssl->major_ver;
        pmVar29 = ssl->handshake;
        pmVar29->max_major_ver = uVar18;
        uVar1 = ssl->minor_ver;
        pmVar29->max_minor_ver = uVar1;
        pmVar36 = ssl->conf;
        if ((int)uVar1 < (int)(uint)pmVar36->min_minor_ver ||
            (int)uVar18 < (int)(uint)pmVar36->min_major_ver) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                     ,0x51e,"client only supports ssl smaller than minimum [%d:%d] < [%d:%d]",
                     (ulong)uVar18,CONCAT44(uVar57,uVar1),
                     CONCAT44(uVar56,(uint)pmVar36->min_major_ver),(uint)pmVar36->min_minor_ver);
          mbedtls_ssl_send_alert_message(ssl,'\x02','F');
          return -0x6e80;
        }
        if (pmVar36->max_major_ver < uVar18) {
          ssl->major_ver = (uint)pmVar36->max_major_ver;
          bVar12 = pmVar36->max_minor_ver;
LAB_0016fc1a:
          *minor = (uint)bVar12;
        }
        else {
          bVar12 = pmVar36->max_minor_ver;
          if (bVar12 < uVar1) goto LAB_0016fc1a;
        }
        mbedtls_debug_print_buf
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                   ,0x531,"client hello, random bytes",buf_00 + 2,0x20);
        pmVar29 = ssl->handshake;
        uVar7 = *(undefined8 *)(buf_00 + 2);
        uVar8 = *(undefined8 *)(buf_00 + 10);
        uVar9 = *(undefined8 *)(buf_00 + 0x1a);
        *(undefined8 *)(pmVar29->randbytes + 0x10) = *(undefined8 *)(buf_00 + 0x12);
        *(undefined8 *)(pmVar29->randbytes + 0x18) = uVar9;
        *(undefined8 *)pmVar29->randbytes = uVar7;
        *(undefined8 *)(pmVar29->randbytes + 8) = uVar8;
        uVar35 = (ulong)buf_00[0x22];
        if ((0x20 < uVar35) || (uVar38 = uVar35 + 0x24, uVar53 < uVar38)) {
          iVar17 = 0x53d;
          goto LAB_0016e9c7;
        }
        mbedtls_debug_print_buf
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                   ,0x541,"client hello, session id",buf_00 + 0x23,uVar35);
        pmVar26 = ssl->session_negotiate;
        pmVar26->id_len = uVar35;
        pmVar26->id[0] = '\0';
        pmVar26->id[1] = '\0';
        pmVar26->id[2] = '\0';
        pmVar26->id[3] = '\0';
        pmVar26->id[4] = '\0';
        pmVar26->id[5] = '\0';
        pmVar26->id[6] = '\0';
        pmVar26->id[7] = '\0';
        pmVar26->id[8] = '\0';
        pmVar26->id[9] = '\0';
        pmVar26->id[10] = '\0';
        pmVar26->id[0xb] = '\0';
        pmVar26->id[0xc] = '\0';
        pmVar26->id[0xd] = '\0';
        pmVar26->id[0xe] = '\0';
        pmVar26->id[0xf] = '\0';
        pmVar26->id[0x10] = '\0';
        pmVar26->id[0x11] = '\0';
        pmVar26->id[0x12] = '\0';
        pmVar26->id[0x13] = '\0';
        pmVar26->id[0x14] = '\0';
        pmVar26->id[0x15] = '\0';
        pmVar26->id[0x16] = '\0';
        pmVar26->id[0x17] = '\0';
        pmVar26->id[0x18] = '\0';
        pmVar26->id[0x19] = '\0';
        pmVar26->id[0x1a] = '\0';
        pmVar26->id[0x1b] = '\0';
        pmVar26->id[0x1c] = '\0';
        pmVar26->id[0x1d] = '\0';
        pmVar26->id[0x1e] = '\0';
        pmVar26->id[0x1f] = '\0';
        memcpy(ssl->session_negotiate->id,buf_00 + 0x23,ssl->session_negotiate->id_len);
        if ((ssl->conf->field_0x164 & 2) == 0) {
          local_1e0 = (mbedtls_ssl_key_cert *)(uVar35 + 0x23);
        }
        else {
          uVar41 = (ulong)buf_00[uVar35 + 0x23];
          if (uVar53 < uVar38 + uVar41 + 2) {
            iVar17 = 0x554;
            goto LAB_0016e9c7;
          }
          local_1e0 = (mbedtls_ssl_key_cert *)(uVar38 + uVar41);
          mbedtls_debug_print_buf
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                     ,0x559,"client hello, cookie",buf_00 + uVar35 + 0x24,uVar41);
          p_Var4 = ssl->conf->f_cookie_check;
          if ((p_Var4 == (_func_int_void_ptr_uchar_ptr_size_t_uchar_ptr_size_t *)0x0) ||
             (ssl->renego_status != 0)) {
            if (uVar41 != 0) {
              iVar17 = 0x575;
              goto LAB_0016e9c7;
            }
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                       ,0x579,"cookie verification skipped");
          }
          else {
            iVar17 = (*p_Var4)(ssl->conf->p_cookie,buf_00 + uVar35 + 0x24,uVar41,ssl->cli_id,
                               ssl->cli_id_len);
            if (iVar17 == 0) {
              mbedtls_debug_print_msg
                        (ssl,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                         ,0x56b,"cookie verification passed");
              ssl->handshake->verify_cookie_len = '\0';
            }
            else {
              mbedtls_debug_print_msg
                        (ssl,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                         ,0x566,"cookie verification failed");
              ssl->handshake->verify_cookie_len = '\x01';
            }
          }
        }
        uVar38 = (ulong)CONCAT11(buf_00[(long)local_1e0],buf_00[(long)local_1e0 + 1]);
        if ((1 < uVar38) && ((buf_00[(long)local_1e0 + 1] & 1) == 0)) {
          uVar41 = (long)local_1e0 + uVar38 + 2;
          if (uVar41 < uVar53) {
            local_178 = buf_00 + (long)local_1e0 + 2;
            mbedtls_debug_print_buf
                      (ssl,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                       ,0x591,"client hello, ciphersuitelist",local_178,uVar38);
            bVar12 = buf_00[uVar41];
            if ((0xf < (byte)(bVar12 - 1)) || (uVar41 = bVar12 + uVar41, uVar53 <= uVar41)) {
              iVar17 = 0x59e;
              goto LAB_0016e9c7;
            }
            mbedtls_debug_print_buf
                      (ssl,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                       ,0x5a3,"client hello, compression",buf_00 + (long)local_1e0 + uVar38 + 3,
                       (ulong)bVar12);
            ssl->session_negotiate->compression = 0;
            if (uVar41 + 1 < uVar53) {
              if (uVar53 < uVar41 + 3) {
                iVar17 = 0x5bf;
                goto LAB_0016e9c7;
              }
              local_1c0 = (size_t)(ushort)(*(ushort *)(buf_00 + uVar41 + 1) << 8 |
                                          *(ushort *)(buf_00 + uVar41 + 1) >> 8);
              if ((0xfffffffffffffffc < local_1c0 - 4) || (uVar53 != uVar41 + 3 + local_1c0)) {
                iVar17 = 0x5c9;
                goto LAB_0016e9c7;
              }
            }
            else {
              local_1c0 = 0;
            }
            local_1e8 = (ushort *)(buf_00 + uVar41 + 3);
            mbedtls_debug_print_buf
                      (ssl,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                       ,0x5d1,"client hello extensions",(uchar *)local_1e8,local_1c0);
            local_180 = ssl->peer_verify_data;
            bVar10 = false;
            do {
              if (local_1c0 == 0) {
                uVar53 = 0;
                goto LAB_0017099b;
              }
              uVar14 = local_1e8[1] << 8 | local_1e8[1] >> 8;
              uVar53 = (ulong)uVar14;
              local_170 = (ulong)(uVar14 + 4);
              bVar55 = local_1c0 < local_170;
              local_1c0 = local_1c0 - local_170;
              if (bVar55) {
                iVar17 = 0x5dc;
                goto LAB_0016e9c7;
              }
              uVar15 = *local_1e8 << 8 | *local_1e8 >> 8;
              uVar41 = (ulong)uVar15;
              if (uVar15 < 0x11) {
                uVar18 = (uint)uVar14;
                switch(uVar15) {
                case 0:
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                             ,0x5e3,"found ServerName extension");
                  if (ssl->conf->f_sni !=
                      (_func_int_void_ptr_mbedtls_ssl_context_ptr_uchar_ptr_size_t *)0x0) {
                    mbedtls_debug_print_msg
                              (ssl,3,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                               ,0x62,"parse ServerName extension");
                    uVar14 = local_1e8[2] << 8 | local_1e8[2] >> 8;
                    uVar53 = (ulong)uVar14;
                    if (uVar14 + 2 != uVar18) {
                      iVar17 = 0x67;
                      goto LAB_0016e9c7;
                    }
                    puVar45 = local_1e8 + 3;
                    while (uVar53 != 0) {
                      uVar51 = (ulong)(ushort)(*(ushort *)((long)puVar45 + 1) << 8 |
                                              *(ushort *)((long)puVar45 + 1) >> 8);
                      uVar41 = uVar51 + 3;
                      bVar55 = uVar53 < uVar41;
                      uVar53 = uVar53 - uVar41;
                      if (bVar55) {
                        iVar17 = 0x71;
                        goto LAB_0016e9c7;
                      }
                      if ((byte)*puVar45 == 0) {
                        iVar17 = (*ssl->conf->f_sni)(ssl->conf->p_sni,ssl,
                                                     (byte *)((long)puVar45 + 3),uVar51);
                        if (iVar17 != 0) {
                          mbedtls_debug_print_ret
                                    (ssl,1,
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                                     ,0x7b,"ssl_sni_wrapper",iVar17);
                          uVar13 = 'p';
                          goto LAB_00170a65;
                        }
                        break;
                      }
                      puVar45 = (ushort *)((long)puVar45 + uVar41);
                    }
                  }
                  break;
                case 1:
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                             ,0x61d,"found max fragment length extension");
                  if ((uVar18 != 1) || (4 < (byte)local_1e8[2])) {
                    iVar17 = 0x148;
                    goto LAB_0016e9c7;
                  }
                  ssl->session_negotiate->mfl_code = (byte)local_1e8[2];
                  break;
                default:
switchD_001700bc_caseD_2:
                  iVar17 = 3;
                  iVar16 = 0x659;
                  pcVar44 = "unknown extension found: %d (ignoring)";
                  goto LAB_0017073d;
                case 4:
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                             ,0x627,"found truncated hmac extension");
                  if (uVar14 != 0) {
                    iVar17 = 0x159;
                    goto LAB_0016e9c7;
                  }
                  if ((ssl->conf->field_0x165 & 0x80) != 0) {
                    ssl->session_negotiate->trunc_hmac = 1;
                  }
                  break;
                case 10:
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                             ,0x60a,"found supported elliptic curves extension");
                  bVar12 = *(byte *)((long)local_1e8 + 5);
                  if (((bVar12 & 1) != 0) ||
                     (uVar53 = (ulong)(byte)local_1e8[2] * 0x100,
                     (int)uVar53 + (uint)bVar12 + 2 != (uint)uVar14)) {
                    iVar17 = 0xf8;
                    goto LAB_0016e9c7;
                  }
                  pmVar29 = ssl->handshake;
                  if (pmVar29->curves != (mbedtls_ecp_curve_info **)0x0) {
                    iVar17 = 0xff;
                    goto LAB_0016e9c7;
                  }
                  uVar53 = uVar53 | bVar12;
                  uVar41 = uVar53 >> 1;
                  if (10 < uVar41) {
                    uVar41 = 0xb;
                  }
                  uVar41 = uVar41 + 1;
                  ppmVar33 = (mbedtls_ecp_curve_info **)calloc(uVar41,8);
                  if (ppmVar33 == (mbedtls_ecp_curve_info **)0x0) {
                    return -0x7f00;
                  }
                  pmVar29->curves = ppmVar33;
                  uVar51 = 0;
                  while ((uVar53 != uVar51 && (1 < uVar41))) {
                    uVar14 = *(ushort *)((long)local_1e8 + uVar51 + 6);
                    pmVar34 = mbedtls_ecp_curve_info_from_tls_id(uVar14 << 8 | uVar14 >> 8);
                    if (pmVar34 != (mbedtls_ecp_curve_info *)0x0) {
                      *ppmVar33 = pmVar34;
                      ppmVar33 = ppmVar33 + 1;
                      uVar41 = uVar41 - 1;
                    }
                    uVar51 = uVar51 + 2;
                  }
                  break;
                case 0xb:
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                             ,0x612,"found supported point formats extension");
                  pmVar29 = ssl->handshake;
                  piVar5 = &pmVar29->cli_exts;
                  *piVar5 = *piVar5 | 1;
                  if ((byte)local_1e8[2] + 1 != uVar18) {
                    iVar17 = 0x12a;
                    goto LAB_0016e9c7;
                  }
                  uVar53 = 0;
                  do {
                    uVar41 = uVar53;
                    if ((byte)local_1e8[2] == uVar41) goto LAB_00170744;
                    uVar18 = (uint)*(byte *)((long)local_1e8 + uVar41 + 5);
                    uVar53 = uVar41 + 1;
                  } while (1 < uVar18);
                  (pmVar29->ecdh_ctx).point_format = uVar18;
                  uVar41 = (ulong)*(byte *)((long)local_1e8 + uVar41 + 5);
                  iVar17 = 4;
                  iVar16 = 0x135;
                  pcVar44 = "point format selected: %d";
LAB_0017073d:
                  mbedtls_debug_print_msg
                            (ssl,iVar17,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                             ,iVar16,pcVar44,uVar41);
                  break;
                case 0xd:
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                             ,0x5fb,"found signature_algorithms extension");
                  if (ssl->renego_status != 1) {
                    if (((*(byte *)((long)local_1e8 + 5) & 1) == 0) &&
                       ((uint)*(byte *)((long)local_1e8 + 5) + (uint)(byte)local_1e8[2] * 0x100 + 2
                        == (uint)uVar14)) {
                      local_1a0 = local_1e8 + 3;
                      for (pmVar54 = (mbedtls_md_type_t *)ssl->conf->sig_hashes; puVar45 = local_1a0
                          , *pmVar54 != MBEDTLS_MD_NONE; pmVar54 = pmVar54 + 1) {
                        while (puVar42 = puVar45, puVar42 < (ushort *)((long)local_1e8 + uVar53 + 4)
                              ) {
                          mVar20 = *pmVar54;
                          mVar22 = mbedtls_ssl_md_alg_from_hash((byte)*puVar42);
                          puVar45 = puVar42 + 1;
                          if (mVar20 == mVar22) {
                            uVar41 = (ulong)(byte)*puVar42;
                            ssl->handshake->sig_alg = (uint)(byte)*puVar42;
                            iVar17 = 3;
                            iVar16 = 0xe4;
                            pcVar44 = "client hello v3, signature_algorithm ext: %d";
                            goto LAB_0017073d;
                          }
                        }
                      }
                      iVar17 = 0xdf;
                      pcVar44 = "no signature_algorithm in common";
                      goto LAB_0017070f;
                    }
                    iVar17 = 0xcb;
                    goto LAB_0016e9c7;
                  }
                  break;
                case 0x10:
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                             ,0x64f,"found alpn extension");
                  local_190 = ssl->conf->alpn_list;
                  if (local_190 != (char **)0x0) {
                    if (uVar18 < 4) {
                      return -0x7900;
                    }
                    if ((ulong)(ushort)(local_1e8[2] << 8 | local_1e8[2] >> 8) != uVar53 - 2) {
                      return -0x7900;
                    }
                    local_188 = local_1e8 + 3;
                    local_1a0 = (ushort *)((long)local_1e8 + uVar53 + 4);
                    do {
                      local_1a8 = *local_190;
                      if (local_1a8 == (char *)0x0) {
                        mbedtls_ssl_send_alert_message(ssl,'\x02','x');
                        return -0x7900;
                      }
                      sVar30 = strlen(local_1a8);
                      for (puVar45 = local_188; puVar45 != local_1a0;
                          puVar45 = (ushort *)((byte *)((long)puVar45 + 1) + uVar53)) {
                        if (local_1a0 < puVar45) {
                          return -0x7900;
                        }
                        uVar53 = (ulong)(byte)*puVar45;
                        if (uVar53 == 0) {
                          return -0x7900;
                        }
                        if ((sVar30 == uVar53) &&
                           (iVar17 = bcmp((byte *)((long)puVar45 + 1),local_1a8,sVar30), iVar17 == 0
                           )) {
                          ssl->alpn_chosen = local_1a8;
                          goto LAB_00170744;
                        }
                      }
                      local_190 = local_190 + 1;
                    } while( true );
                  }
                }
              }
              else if (uVar15 == 0x16) {
                mbedtls_debug_print_msg
                          (ssl,3,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                           ,0x631,"found encrypt then mac extension");
                if (uVar14 != 0) {
                  iVar17 = 0x16d;
                  goto LAB_0016e9c7;
                }
                if (((ssl->conf->field_0x165 & 4) != 0) && (*minor != 0)) {
                  ssl->session_negotiate->encrypt_then_mac = 1;
                }
              }
              else if (uVar15 == 0x17) {
                mbedtls_debug_print_msg
                          (ssl,3,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                           ,0x63b,"found extended master secret extension");
                if (uVar14 != 0) {
                  iVar17 = 0x184;
                  goto LAB_0016e9c7;
                }
                if (((ssl->conf->field_0x165 & 8) != 0) && (*minor != 0)) {
                  ssl->handshake->extended_ms = 1;
                }
              }
              else {
                if (uVar15 == 0x23) {
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                             ,0x645,"found session ticket extension");
                  mbedtls_ssl_session_init((mbedtls_ssl_session *)&mbedtls_sha1);
                  if ((ssl->conf->f_ticket_parse !=
                       (_func_int_void_ptr_mbedtls_ssl_session_ptr_uchar_ptr_size_t *)0x0) &&
                     (ssl->conf->f_ticket_write !=
                      (_func_int_void_ptr_mbedtls_ssl_session_ptr_uchar_ptr_uchar_ptr_size_t_ptr_uint32_t_ptr
                       *)0x0)) {
                    ssl->handshake->new_session_ticket = 1;
                    mbedtls_debug_print_msg
                              (ssl,3,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                               ,0x1a7,"ticket length: %d",uVar53);
                    if (uVar14 != 0) {
                      if (ssl->renego_status == 0) {
                        iVar17 = (*ssl->conf->f_ticket_parse)
                                           (ssl->conf->p_ticket,(mbedtls_ssl_session *)&mbedtls_sha1
                                            ,(uchar *)(local_1e8 + 2),uVar53);
                        if (iVar17 == 0) {
                          pmVar26 = ssl->session_negotiate;
                          mbedtls_sha1.state._8_8_ = pmVar26->id_len;
                          memcpy(mbedtls_sha1.state + 4,pmVar26->id,mbedtls_sha1.state._8_8_);
                          mbedtls_ssl_session_free(pmVar26);
                          memcpy(ssl->session_negotiate,&mbedtls_sha1,0x98);
                          for (lVar50 = -0x98; lVar50 != 0; lVar50 = lVar50 + 1) {
                            auStack_d0[lVar50] = 0;
                          }
                          mbedtls_debug_print_msg
                                    (ssl,3,
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                                     ,0x1d3,"session successfully restored from ticket");
                          pmVar29 = ssl->handshake;
                          pmVar29->resume = 1;
                          pmVar29->new_session_ticket = 0;
                          goto LAB_00170744;
                        }
                        mbedtls_ssl_session_free((mbedtls_ssl_session *)&mbedtls_sha1);
                        if (iVar17 == -0x6d80) {
                          iVar17 = 0x1bf;
                          pcVar44 = "ticket is expired";
                        }
                        else {
                          if (iVar17 != -0x7180) {
                            mbedtls_debug_print_ret
                                      (ssl,1,
                                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                                       ,0x1c1,"mbedtls_ssl_ticket_parse",iVar17);
                            goto LAB_00170744;
                          }
                          iVar17 = 0x1bd;
                          pcVar44 = "ticket is not authentic";
                        }
                      }
                      else {
                        iVar17 = 0x1af;
                        pcVar44 = "ticket rejected: renegotiating";
                      }
LAB_0017070f:
                      mbedtls_debug_print_msg
                                (ssl,3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                                 ,iVar17,pcVar44);
                    }
                  }
                  goto LAB_00170744;
                }
                if (uVar15 != 0xff01) goto switchD_001700bc_caseD_2;
                mbedtls_debug_print_msg
                          (ssl,3,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                           ,0x5ee,"found renegotiation extension");
                if (ssl->renego_status != 0) {
                  sVar31 = ssl->verify_data_len;
                  if ((sVar31 + 1 == uVar53) && (sVar31 == (byte)local_1e8[2])) {
                    iVar17 = mbedtls_ssl_safer_memcmp
                                       ((byte *)((long)local_1e8 + 5),local_180,sVar31);
                    bVar10 = true;
                    if (iVar17 == 0) goto LAB_00170744;
                  }
                  pcVar44 = "non-matching renegotiation info";
                  iVar17 = 0xa0;
                  goto LAB_001711fa;
                }
                if ((uVar14 != 1) || ((byte)local_1e8[2] != 0)) {
                  pcVar44 = "non-zero length renegotiation info";
                  iVar17 = 0xad;
                  goto LAB_001711fa;
                }
                ssl->secure_renegotiation = 1;
                bVar10 = true;
              }
LAB_00170744:
              local_1e8 = (ushort *)((long)local_1e8 + local_170);
            } while (2 < local_1c0 - 1);
            iVar17 = 0x661;
            goto LAB_0016e9c7;
          }
        }
        iVar17 = 0x58c;
        goto LAB_0016e9c7;
      }
    }
    iVar17 = 0x4bd;
LAB_0016e9c7:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,iVar17,"bad client hello message");
    return -0x7900;
  case 2:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x845,"=> write server hello");
    uVar18 = *(uint *)&ssl->conf->field_0x164;
    if (((uVar18 & 2) != 0) && (ssl->handshake->verify_cookie_len != '\0')) {
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x84b,"client hello was not authenticated");
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x84c,"<= write server hello");
      puVar52 = ssl->out_msg;
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x804,"=> write hello verify request");
      mbedtls_ssl_write_version
                (ssl->major_ver,ssl->minor_ver,*(uint *)&ssl->conf->field_0x164 >> 1 & 1,puVar52 + 4
                );
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x811,"server version",puVar52 + 4,2);
      p_Var2 = ssl->conf->f_cookie_write;
      if (p_Var2 != (_func_int_void_ptr_uchar_ptr_ptr_uchar_ptr_uchar_ptr_size_t *)0x0) {
        auVar48 = (uint32_t  [2])((long)puVar52 + 7);
        mbedtls_sha1.total = auVar48;
        iVar17 = (*p_Var2)(ssl->conf->p_cookie,(uchar **)&mbedtls_sha1,ssl->out_buf + 0x414d,
                           ssl->cli_id,ssl->cli_id_len);
        if (iVar17 == 0) {
          bVar12 = (char)mbedtls_sha1.total[0] - (char)auVar48[0];
          puVar52[6] = bVar12;
          mbedtls_debug_print_buf
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                     ,0x828,"cookie sent",(uchar *)auVar48,(ulong)bVar12);
          ssl->out_msglen = (long)mbedtls_sha1.total - (long)ssl->out_msg;
          ssl->out_msgtype = 0x16;
          *ssl->out_msg = '\x03';
          ssl->state = 0x12;
          iVar17 = mbedtls_ssl_write_record(ssl);
          if (iVar17 == 0) {
            pcVar44 = "<= write hello verify request";
            iVar17 = 0;
            iVar16 = 2;
            line = 0x836;
            goto LAB_0016e178;
          }
          pcVar44 = "mbedtls_ssl_write_record";
          iVar16 = 0x832;
        }
        else {
          pcVar44 = "f_cookie_write";
          iVar16 = 0x822;
        }
        goto LAB_0016dd5a;
      }
      pcVar44 = "inconsistent cookie callbacks";
      iVar17 = 0x817;
LAB_0016e541:
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,iVar17,pcVar44);
      return -0x6c00;
    }
    if (ssl->conf->f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x854,"no RNG provided");
      return -0x7400;
    }
    puVar52 = ssl->out_msg;
    mbedtls_ssl_write_version(ssl->major_ver,ssl->minor_ver,uVar18 >> 1 & 1,puVar52 + 4);
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x867,"server hello, chosen version: [%d:%d]",(ulong)puVar52[4],
               CONCAT44(uVar56,(uint)puVar52[5]));
    tVar24 = time((time_t *)0x0);
    uVar18 = (uint)tVar24;
    *(uint *)(puVar52 + 6) =
         uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x870,"server hello, current time: %lu",tVar24);
    iVar17 = (*ssl->conf->f_rng)(ssl->conf->p_rng,puVar52 + 10,0x1c);
    if (iVar17 != 0) {
      return iVar17;
    }
    pmVar29 = ssl->handshake;
    uVar7 = *(undefined8 *)(puVar52 + 6);
    uVar8 = *(undefined8 *)(puVar52 + 0xe);
    uVar9 = *(undefined8 *)(puVar52 + 0x1e);
    *(undefined8 *)(pmVar29->randbytes + 0x30) = *(undefined8 *)(puVar52 + 0x16);
    *(undefined8 *)(pmVar29->randbytes + 0x38) = uVar9;
    *(undefined8 *)(pmVar29->randbytes + 0x20) = uVar7;
    *(undefined8 *)(pmVar29->randbytes + 0x28) = uVar8;
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x87f,"server hello, random bytes",puVar52 + 6,0x20);
    if (ssl->handshake->resume != 0) goto LAB_0016de6f;
    if ((ssl->renego_status == 0) && (ssl->session_negotiate->id_len != 0)) {
      p_Var3 = ssl->conf->f_get_cache;
      if (p_Var3 == (_func_int_void_ptr_mbedtls_ssl_session_ptr *)0x0) goto LAB_0016e774;
      iVar17 = (*p_Var3)(ssl->conf->p_cache,ssl->session_negotiate);
      if (iVar17 == 0) {
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                   ,0x88e,"session successfully restored from cache");
        ssl->handshake->resume = 1;
      }
      else if (ssl->handshake->resume == 0) goto LAB_0016e774;
LAB_0016de6f:
      sStackY_210 = ssl->session_negotiate->id_len;
      ssl->state = 0xc;
      iVar17 = mbedtls_ssl_derive_keys(ssl);
      if (iVar17 != 0) {
        pcVar44 = "mbedtls_ssl_derive_keys";
        iVar16 = 0x8b7;
        goto LAB_0016dd5a;
      }
    }
    else {
LAB_0016e774:
      ssl->state = ssl->state + 1;
      tVar24 = time((time_t *)0x0);
      pmVar26 = ssl->session_negotiate;
      pmVar26->start = tVar24;
      if (ssl->handshake->new_session_ticket == 0) {
        pmVar26->id_len = 0x20;
        sStackY_210 = 0x20;
        iVar17 = (*ssl->conf->f_rng)(ssl->conf->p_rng,pmVar26->id,0x20);
        if (iVar17 != 0) {
          return iVar17;
        }
      }
      else {
        pmVar26->id[8] = '\0';
        pmVar26->id[9] = '\0';
        pmVar26->id[10] = '\0';
        pmVar26->id[0xb] = '\0';
        pmVar26->id[0xc] = '\0';
        pmVar26->id[0xd] = '\0';
        pmVar26->id[0xe] = '\0';
        pmVar26->id[0xf] = '\0';
        pmVar26->id[0x10] = '\0';
        pmVar26->id[0x11] = '\0';
        pmVar26->id[0x12] = '\0';
        pmVar26->id[0x13] = '\0';
        pmVar26->id[0x14] = '\0';
        pmVar26->id[0x15] = '\0';
        pmVar26->id[0x16] = '\0';
        pmVar26->id[0x17] = '\0';
        pmVar26->id_len = 0;
        pmVar26->id[0] = '\0';
        pmVar26->id[1] = '\0';
        pmVar26->id[2] = '\0';
        pmVar26->id[3] = '\0';
        pmVar26->id[4] = '\0';
        pmVar26->id[5] = '\0';
        pmVar26->id[6] = '\0';
        pmVar26->id[7] = '\0';
        pmVar26->id[0x18] = '\0';
        pmVar26->id[0x19] = '\0';
        pmVar26->id[0x1a] = '\0';
        pmVar26->id[0x1b] = '\0';
        pmVar26->id[0x1c] = '\0';
        pmVar26->id[0x1d] = '\0';
        pmVar26->id[0x1e] = '\0';
        pmVar26->id[0x1f] = '\0';
        sStackY_210 = 0;
      }
    }
    puVar52[0x26] = (uchar)ssl->session_negotiate->id_len;
    memcpy(puVar52 + 0x27,ssl->session_negotiate->id,ssl->session_negotiate->id_len);
    sVar31 = ssl->session_negotiate->id_len;
    puVar40 = puVar52 + sVar31 + 0x27;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x8c8,"server hello, session id len.: %d",sStackY_210);
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x8c9,"server hello, session id",puVar52 + 0x27,sStackY_210);
    pcVar44 = "a";
    if (ssl->handshake->resume == 0) {
      pcVar44 = "no";
    }
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x8cb,"%s session has been resumed",pcVar44);
    *puVar40 = *(uchar *)((long)&ssl->session_negotiate->ciphersuite + 1);
    puVar52[sVar31 + 0x28] = (uchar)ssl->session_negotiate->ciphersuite;
    puVar52[sVar31 + 0x29] = (uchar)ssl->session_negotiate->compression;
    pcVar44 = mbedtls_ssl_get_ciphersuite_name(ssl->session_negotiate->ciphersuite);
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x8d2,"server hello, chosen ciphersuite: %s",pcVar44);
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x8d4,"server hello, compress alg.: 0x%02X",
               (ulong)(uint)ssl->session_negotiate->compression);
    puVar46 = puVar52 + sVar31 + 0x2c;
    if (ssl->secure_renegotiation == 1) {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x784,"server hello, secure renegotiation extension");
      (puVar52 + sVar31 + 0x2c)[0] = 0xff;
      (puVar52 + sVar31 + 0x2c)[1] = '\x01';
      iVar17 = ssl->renego_status;
      puVar52[sVar31 + 0x2e] = '\0';
      if (iVar17 == 0) {
        (puVar52 + sVar31 + 0x2f)[0] = '\x01';
        (puVar52 + sVar31 + 0x2f)[1] = '\0';
        puVar40 = puVar52 + sVar31 + 0x31;
      }
      else {
        puVar52[sVar31 + 0x2f] = (char)ssl->verify_data_len * '\x02' + '\x01';
        puVar52[sVar31 + 0x30] = (char)ssl->verify_data_len * '\x02';
        memcpy(puVar52 + sVar31 + 0x31,ssl->peer_verify_data,ssl->verify_data_len);
        sVar30 = ssl->verify_data_len;
        memcpy(puVar40 + sVar30 + 10,ssl->own_verify_data,sVar30);
        puVar40 = puVar40 + sVar30 + 10 + ssl->verify_data_len;
      }
      lVar37 = (long)puVar40 - (long)puVar46;
    }
    else {
      lVar37 = 0;
    }
    pmVar26 = ssl->session_negotiate;
    if (pmVar26->mfl_code == '\0') {
      lVar50 = 0;
    }
    else {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x7ad,"server hello, max_fragment_length extension");
      puVar40 = puVar46 + lVar37;
      puVar40[0] = '\0';
      puVar40[1] = '\x01';
      puVar40[2] = '\0';
      puVar40[3] = '\x01';
      puVar52[lVar37 + sVar31 + 0x30] = ssl->session_negotiate->mfl_code;
      pmVar26 = ssl->session_negotiate;
      lVar50 = 5;
    }
    if (pmVar26->trunc_hmac == 0) {
      lVar49 = 0;
    }
    else {
      lVar49 = 4;
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x70d,"server hello, adding truncated hmac extension");
      puVar40 = puVar46 + lVar50 + lVar37;
      puVar40[0] = '\0';
      puVar40[1] = '\x04';
      puVar40[2] = '\0';
      puVar40[3] = '\0';
      pmVar26 = ssl->session_negotiate;
    }
    lVar49 = lVar49 + lVar50 + lVar37;
    if ((((pmVar26->encrypt_then_mac == 0) || (ssl->minor_ver == 0)) ||
        (pmVar27 = mbedtls_ssl_ciphersuite_from_id(pmVar26->ciphersuite),
        pmVar27 == (mbedtls_ssl_ciphersuite_t *)0x0)) ||
       ((pmVar28 = mbedtls_cipher_info_from_type(pmVar27->cipher),
        pmVar28 == (mbedtls_cipher_info_t *)0x0 || (pmVar28->mode != MBEDTLS_MODE_CBC)))) {
      lVar37 = 0;
    }
    else {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x738,"server hello, adding encrypt then mac extension");
      puVar40 = puVar46 + lVar49;
      puVar40[0] = '\0';
      puVar40[1] = '\x16';
      puVar40[2] = '\0';
      puVar40[3] = '\0';
      lVar37 = 4;
    }
    lVar37 = lVar37 + lVar49;
    pmVar29 = ssl->handshake;
    if ((pmVar29->extended_ms == 0) || (ssl->minor_ver == 0)) {
      lVar50 = 0;
    }
    else {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x753,"server hello, adding extended master secret extension");
      puVar40 = puVar46 + lVar37;
      puVar40[0] = '\0';
      puVar40[1] = '\x17';
      puVar40[2] = '\0';
      puVar40[3] = '\0';
      pmVar29 = ssl->handshake;
      lVar50 = 4;
    }
    lVar50 = lVar50 + lVar37;
    if (pmVar29->new_session_ticket == 0) {
      lVar37 = 0;
    }
    else {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x76c,"server hello, adding session ticket extension");
      puVar40 = puVar46 + lVar50;
      puVar40[0] = '\0';
      puVar40[1] = '#';
      puVar40[2] = '\0';
      puVar40[3] = '\0';
      pmVar29 = ssl->handshake;
      lVar37 = 4;
    }
    lVar37 = lVar37 + lVar50;
    if ((pmVar29->cli_exts & 1) == 0) {
      lVar50 = 0;
    }
    else {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x7ca,"server hello, supported_point_formats extension");
      puVar40 = puVar46 + lVar37;
      puVar40[0] = '\0';
      puVar40[1] = '\v';
      puVar40[2] = '\0';
      puVar40[3] = '\x02';
      (puVar52 + lVar37 + sVar31 + 0x30)[0] = '\x01';
      (puVar52 + lVar37 + sVar31 + 0x30)[1] = '\0';
      lVar50 = 6;
    }
    lVar50 = lVar50 + lVar37;
    if (ssl->alpn_chosen == (char *)0x0) {
      lVar37 = 0;
    }
    else {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x7e3,"server hello, adding alpn extension");
      puVar40 = puVar46 + lVar50 + 7;
      puVar40[-7] = '\0';
      puVar40[-6] = '\x10';
      sVar30 = strlen(ssl->alpn_chosen);
      lVar37 = sVar30 + 7;
      puVar52[lVar50 + sVar31 + 0x2e] = (uchar)((uint)((int)sVar30 + 3) >> 8);
      cVar6 = (char)lVar37;
      puVar40[-4] = cVar6 + 0xfc;
      puVar52[lVar50 + sVar31 + 0x30] = (uchar)((uint)((int)sVar30 + 1) >> 8);
      puVar40[-2] = cVar6 + 0xfa;
      puVar40[-1] = cVar6 + 0xf9;
      memcpy(puVar40,ssl->alpn_chosen,sVar30);
    }
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x8ff,"server hello, total extension length: %d",lVar37 + lVar50);
    lVar37 = lVar37 + lVar50;
    if (lVar37 == 0) {
      puVar46 = puVar52 + sVar31 + 0x2a;
    }
    else {
      *(ushort *)(puVar52 + sVar31 + 0x2a) = (ushort)lVar37 << 8 | (ushort)lVar37 >> 8;
      puVar46 = puVar46 + lVar37;
    }
    ssl->out_msglen = (long)puVar46 - (long)puVar52;
    ssl->out_msgtype = 0x16;
    *ssl->out_msg = '\x02';
    iVar17 = mbedtls_ssl_write_record(ssl);
    pcVar44 = "<= write server hello";
    iVar16 = 0x90e;
LAB_0016ed96:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,iVar16,pcVar44);
    return iVar17;
  case 3:
    iVar17 = mbedtls_ssl_write_certificate(ssl);
    return iVar17;
  case 4:
    puVar40 = ssl->out_msg;
    pmVar27 = ssl->transform_negotiate->ciphersuite_info;
    puVar52 = puVar40 + 4;
    lVar37 = 0;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x9fb,"=> write server key exchange");
    mVar19 = pmVar27->key_exchange;
    puVar46 = puVar52;
    if (mVar19 < (MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA|MBEDTLS_KEY_EXCHANGE_RSA)) {
      if ((0xa2U >> (mVar19 & 0x1f) & 1) != 0) {
        pcVar44 = "<= skip write server key exchange";
        iVar17 = 0xa04;
LAB_0016e604:
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                   ,iVar17,pcVar44);
        ssl->state = ssl->state + 1;
        return 0;
      }
      if ((0x140U >> (mVar19 & 0x1f) & 1) == 0) {
        if ((0x600U >> (mVar19 & 0x1f) & 1) != 0) {
          pmVar23 = mbedtls_ssl_own_key(ssl);
          iVar17 = mbedtls_pk_can_do(pmVar23,MBEDTLS_PK_ECKEY);
          if (iVar17 == 0) {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                       ,0x9d7,"server key not ECDH capable");
          }
          else {
            pmVar29 = ssl->handshake;
            pmVar23 = mbedtls_ssl_own_key(ssl);
            iVar17 = mbedtls_ecdh_get_params
                               (&pmVar29->ecdh_ctx,(mbedtls_ecp_keypair *)pmVar23->pk_ctx,
                                MBEDTLS_ECDH_OURS);
            if (iVar17 != 0) {
              mbedtls_debug_print_ret
                        (ssl,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                         ,0x9df,"mbedtls_ecdh_get_params",iVar17);
            }
          }
          pcVar44 = "<= skip write server key exchange";
          iVar17 = 0xa11;
          goto LAB_0016e604;
        }
      }
      else {
        puVar40[4] = '\0';
        puVar40[5] = '\0';
        lVar37 = 2;
        mVar19 = pmVar27->key_exchange;
        puVar46 = puVar40 + 6;
      }
    }
    if ((mVar19 | MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA) == MBEDTLS_KEY_EXCHANGE_DHE_PSK) {
      pmVar36 = ssl->conf;
      if (((pmVar36->dhm_P).p == (mbedtls_mpi_uint *)0x0) ||
         ((pmVar36->dhm_G).p == (mbedtls_mpi_uint *)0x0)) {
        pcVar44 = "no DH parameters set";
        iVar16 = 1;
        line = 0xa2c;
        goto LAB_0016e178;
      }
      iVar17 = mbedtls_mpi_copy(&(ssl->handshake->dhm_ctx).P,&pmVar36->dhm_P);
      if ((iVar17 != 0) ||
         (iVar17 = mbedtls_mpi_copy(&(ssl->handshake->dhm_ctx).G,&ssl->conf->dhm_G), iVar17 != 0)) {
        pcVar44 = "mbedtls_mpi_copy";
        iVar16 = 0xa3c;
        goto LAB_0016dd5a;
      }
      pmVar29 = ssl->handshake;
      sVar31 = mbedtls_mpi_size(&(pmVar29->dhm_ctx).P);
      iVar17 = mbedtls_dhm_make_params
                         (&pmVar29->dhm_ctx,(int)sVar31,puVar46,&len,ssl->conf->f_rng,
                          ssl->conf->p_rng);
      sVar31 = len;
      if (iVar17 != 0) {
        pcVar44 = "mbedtls_dhm_make_params";
        iVar16 = 0xa44;
        goto LAB_0016dd5a;
      }
      puVar40 = puVar46 + len;
      lVar37 = lVar37 + len;
      mbedtls_debug_print_mpi
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0xa4e,"DHM: X ",&(ssl->handshake->dhm_ctx).X);
      mbedtls_debug_print_mpi
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0xa4f,"DHM: P ",&(ssl->handshake->dhm_ctx).P);
      mbedtls_debug_print_mpi
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0xa50,"DHM: G ",&(ssl->handshake->dhm_ctx).G);
      mbedtls_debug_print_mpi
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0xa51,"DHM: GX",&(ssl->handshake->dhm_ctx).GX);
      mVar19 = pmVar27->key_exchange;
      puVar52 = puVar46;
    }
    else {
      sVar31 = 0;
      puVar40 = puVar46;
    }
    local_1f0 = puVar40;
    if ((mVar19 < MBEDTLS_KEY_EXCHANGE_ECDH_RSA) && ((0x118U >> (mVar19 & 0x1f) & 1) != 0)) {
      ppmVar33 = (mbedtls_ecp_curve_info **)0x0;
      for (pmVar25 = ssl->conf->curve_list; *pmVar25 != MBEDTLS_ECP_DP_NONE; pmVar25 = pmVar25 + 1)
      {
        for (ppmVar33 = ssl->handshake->curves; pmVar34 = *ppmVar33,
            pmVar34 != (mbedtls_ecp_curve_info *)0x0; ppmVar33 = ppmVar33 + 1) {
          if (pmVar34->grp_id == *pmVar25) goto LAB_0016f10e;
        }
      }
      if ((ppmVar33 == (mbedtls_ecp_curve_info **)0x0) ||
         (pmVar34 = *ppmVar33, pmVar34 == (mbedtls_ecp_curve_info *)0x0)) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                   ,0xa6f,"no matching curve for ECDHE");
        return -0x7380;
      }
LAB_0016f10e:
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0xa73,"ECDHE curve: %s",pmVar34->name);
      iVar17 = mbedtls_ecp_group_load(&(ssl->handshake->ecdh_ctx).grp,(*ppmVar33)->grp_id);
      if (iVar17 != 0) {
        pcVar44 = "mbedtls_ecp_group_load";
        iVar16 = 0xa78;
        goto LAB_0016dd5a;
      }
      iVar17 = mbedtls_ecdh_make_params
                         (&ssl->handshake->ecdh_ctx,&len,puVar40,0x4000 - lVar37,ssl->conf->f_rng,
                          ssl->conf->p_rng);
      if (iVar17 != 0) {
        pcVar44 = "mbedtls_ecdh_make_params";
        iVar16 = 0xa80;
        goto LAB_0016dd5a;
      }
      local_1f0 = puVar40 + len;
      lVar37 = lVar37 + len;
      mbedtls_debug_print_ecp
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0xa8a,"ECDH: Q ",&(ssl->handshake->ecdh_ctx).Q);
      mVar19 = pmVar27->key_exchange;
      sVar31 = len;
      puVar52 = puVar40;
    }
    if (mVar19 - MBEDTLS_KEY_EXCHANGE_DHE_RSA < 3) {
      signature_len = 0;
      if (ssl->minor_ver == 3) {
        mVar20 = mbedtls_ssl_md_alg_from_hash((uchar)ssl->handshake->sig_alg);
        if (mVar20 == MBEDTLS_MD_NONE) {
          pcVar44 = "should never happen";
          iVar17 = 0xaa4;
          goto LAB_0016e541;
        }
LAB_0016f253:
        pmVar32 = mbedtls_md_info_from_type(mVar20);
        mbedtls_md_init((mbedtls_md_context_t *)&mbedtls_sha1);
        iVar17 = mbedtls_md_setup((mbedtls_md_context_t *)&mbedtls_sha1,pmVar32,0);
        if (iVar17 != 0) {
          pcVar44 = "mbedtls_md_setup";
          iVar16 = 0xaf8;
          goto LAB_0016dd5a;
        }
        mbedtls_md_starts((mbedtls_md_context_t *)&mbedtls_sha1);
        mbedtls_md_update((mbedtls_md_context_t *)&mbedtls_sha1,ssl->handshake->randbytes,0x40);
        mbedtls_md_update((mbedtls_md_context_t *)&mbedtls_sha1,puVar52,sVar31);
        mbedtls_md_finish((mbedtls_md_context_t *)&mbedtls_sha1,hash);
        mbedtls_md_free((mbedtls_md_context_t *)&mbedtls_sha1);
        pmVar32 = mbedtls_md_info_from_type(mVar20);
        bVar12 = mbedtls_md_get_size(pmVar32);
        sVar31 = (size_t)bVar12;
        hash_len = 0;
      }
      else {
        if (mVar19 == MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA) {
          mVar20 = MBEDTLS_MD_SHA1;
          goto LAB_0016f253;
        }
        mbedtls_md5_init(&mbedtls_md5);
        mbedtls_sha1_init(&mbedtls_sha1);
        mbedtls_md5_starts(&mbedtls_md5);
        mbedtls_md5_update(&mbedtls_md5,ssl->handshake->randbytes,0x40);
        mbedtls_md5_update(&mbedtls_md5,puVar52,sVar31);
        mbedtls_md5_finish(&mbedtls_md5,hash);
        mbedtls_sha1_starts(&mbedtls_sha1);
        mbedtls_sha1_update(&mbedtls_sha1,ssl->handshake->randbytes,0x40);
        mbedtls_sha1_update(&mbedtls_sha1,puVar52,sVar31);
        mbedtls_sha1_finish(&mbedtls_sha1,hash + 0x10);
        mbedtls_md5_free(&mbedtls_md5);
        mbedtls_sha1_free(&mbedtls_sha1);
        mVar20 = MBEDTLS_MD_NONE;
        sVar31 = 0x24;
        hash_len = sVar31;
      }
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0xb0b,"parameters hash",hash,sVar31);
      pmVar23 = mbedtls_ssl_own_key(ssl);
      if (pmVar23 == (mbedtls_pk_context *)0x0) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                   ,0xb12,"got no private key");
        return -0x7600;
      }
      if (ssl->minor_ver == 3) {
        *local_1f0 = (uchar)ssl->handshake->sig_alg;
        pmVar23 = mbedtls_ssl_own_key(ssl);
        uVar13 = mbedtls_ssl_sig_from_pk(pmVar23);
        local_1f0[1] = uVar13;
        local_1f0 = local_1f0 + 2;
        lVar37 = lVar37 + 2;
      }
      pmVar23 = mbedtls_ssl_own_key(ssl);
      iVar17 = mbedtls_pk_sign(pmVar23,mVar20,hash,hash_len,local_1f0 + 2,&signature_len,
                               ssl->conf->f_rng,ssl->conf->p_rng);
      if (iVar17 != 0) {
        pcVar44 = "mbedtls_pk_sign";
        iVar16 = 0xb24;
        goto LAB_0016dd5a;
      }
      *local_1f0 = signature_len._1_1_;
      local_1f0[1] = (uchar)signature_len;
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0xb2c,"my signature",local_1f0 + 2,signature_len);
      lVar37 = lVar37 + signature_len + 2;
    }
    ssl->out_msglen = lVar37 + 4;
    ssl->out_msgtype = 0x16;
    *ssl->out_msg = '\f';
    ssl->state = ssl->state + 1;
    iVar17 = mbedtls_ssl_write_record(ssl);
    if (iVar17 == 0) {
      pcVar44 = "<= write server key exchange";
      iVar17 = 0;
      iVar16 = 2;
      line = 0xb40;
      goto LAB_0016e178;
    }
    pcVar44 = "mbedtls_ssl_write_record";
    iVar16 = 0xb3c;
    goto LAB_0016dd5a;
  case 5:
    pmVar27 = ssl->transform_negotiate->ciphersuite_info;
    puVar52 = ssl->out_msg;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x936,"=> write certificate request");
    ssl->state = ssl->state + 1;
    uVar18 = ssl->handshake->sni_authmode;
    if (uVar18 == 3) {
      uVar18 = *(uint *)&ssl->conf->field_0x164 >> 2 & 3;
    }
    mVar19 = pmVar27->key_exchange;
    if (((mVar19 - MBEDTLS_KEY_EXCHANGE_PSK < 3) || (mVar19 == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK)) ||
       (uVar18 == 0)) {
      pcVar44 = "<= skip write certificate request";
      iVar17 = 0;
      iVar16 = 2;
      line = 0x947;
      goto LAB_0016e178;
    }
    puVar40 = ssl->out_msg;
    puVar40[6] = '@';
    puVar40[4] = '\x02';
    puVar40[5] = '\x01';
    if (ssl->minor_ver == 3) {
      uVar18 = ssl->transform_negotiate->ciphersuite_info->mac == MBEDTLS_MD_SHA384 | 4;
      ssl->handshake->verify_sig_alg = uVar18;
      puVar40[9] = (uchar)uVar18;
      puVar40[10] = '\x01';
      puVar40[0xb] = (uchar)ssl->handshake->verify_sig_alg;
      puVar40[0xc] = '\x03';
      puVar40[7] = '\0';
      puVar40[8] = '\x04';
      lVar37 = 0xd;
      local_1e0 = (mbedtls_ssl_key_cert *)0x6;
    }
    else {
      lVar37 = 7;
      local_1e0 = (mbedtls_ssl_key_cert *)0x0;
    }
    pmVar39 = ssl->handshake->sni_ca_chain;
    if (pmVar39 == (mbedtls_x509_crt *)0x0) {
      pmVar39 = ssl->conf->ca_chain;
    }
    puVar46 = puVar40 + lVar37;
    lVar37 = 0;
    while( true ) {
      puVar45 = (ushort *)(puVar46 + 2);
      if ((pmVar39 == (mbedtls_x509_crt *)0x0) || (pmVar39->version == 0)) goto LAB_0016e4c5;
      if (puVar52 + 0x4000 < puVar45) break;
      sVar30 = (pmVar39->subject_raw).len;
      if ((ulong)((long)(puVar52 + 0x4000) - (long)puVar45) < sVar30 + 2) break;
      buf = puVar46 + 4;
      *puVar45 = (ushort)sVar30 << 8 | (ushort)sVar30 >> 8;
      memcpy(buf,(pmVar39->subject_raw).p,sVar30);
      puVar46 = (uchar *)((long)puVar45 + sVar30);
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x9b8,"requested DN",buf,sVar30);
      lVar37 = lVar37 + sVar30 + 2;
      pmVar39 = pmVar39->next;
    }
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x9af,"skipping CAs: buffer too short");
LAB_0016e4c5:
    ssl->out_msglen = (long)puVar45 - (long)puVar40;
    ssl->out_msgtype = 0x16;
    *ssl->out_msg = '\r';
    ssl->out_msg[(long)local_1e0 + 7] = (uchar)((ulong)lVar37 >> 8);
    ssl->out_msg[(long)local_1e0 + 8] = (uchar)lVar37;
    iVar17 = mbedtls_ssl_write_record(ssl);
    pcVar44 = "<= write certificate request";
    iVar16 = 0x9c6;
    goto LAB_0016ed96;
  case 6:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0xb49,"=> write server hello done");
    ssl->out_msglen = 4;
    ssl->out_msgtype = 0x16;
    *ssl->out_msg = '\x0e';
    ssl->state = ssl->state + 1;
    if ((ssl->conf->field_0x164 & 2) != 0) {
      mbedtls_ssl_send_flight_completed(ssl);
    }
    iVar17 = mbedtls_ssl_write_record(ssl);
    if (iVar17 != 0) {
      pcVar44 = "mbedtls_ssl_write_record";
      iVar16 = 0xb58;
      goto LAB_0016dd5a;
    }
    pcVar44 = "<= write server hello done";
    iVar17 = 0;
    iVar16 = 2;
    line = 0xb5c;
    goto LAB_0016e178;
  case 7:
    iVar17 = mbedtls_ssl_parse_certificate(ssl);
    return iVar17;
  case 8:
    pmVar27 = ssl->transform_negotiate->ciphersuite_info;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0xc3c,"=> parse client key exchange");
    iVar17 = mbedtls_ssl_read_record(ssl);
    if (iVar17 != 0) {
      pcVar44 = "mbedtls_ssl_read_record";
      iVar16 = 0xc40;
      goto LAB_0016dd5a;
    }
    puVar52 = ssl->in_msg;
    uVar53 = (ulong)(*(uint *)&ssl->conf->field_0x164 & 2);
    mbedtls_sha1.total = (uint32_t  [2])((long)puVar52 + uVar53 * 4 + 4);
    if (ssl->in_msgtype != 0x16) {
      pcVar44 = "bad client key exchange message";
      iVar17 = 0xc49;
LAB_0016e62c:
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,iVar17,pcVar44);
      return -0x7c00;
    }
    if (*puVar52 != '\x10') {
      pcVar44 = "bad client key exchange message";
      iVar17 = 0xc4f;
      goto LAB_0016e62c;
    }
    if (9 < pmVar27->key_exchange - MBEDTLS_KEY_EXCHANGE_RSA) {
      pcVar44 = "should never happen";
      iVar17 = 0xd07;
      goto LAB_0016e541;
    }
    break;
  case 9:
    pmVar27 = ssl->transform_negotiate->ciphersuite_info;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0xd3d,"=> parse certificate verify");
    if ((pmVar27->key_exchange - MBEDTLS_KEY_EXCHANGE_PSK < 4) ||
       (ssl->session_negotiate->peer_cert == (mbedtls_x509_crt *)0x0)) {
      pcVar44 = "<= skip parse certificate verify";
      iVar17 = 0xd45;
      goto LAB_0016e604;
    }
    hash_00 = &mbedtls_sha1;
    (*ssl->handshake->calc_verify)(ssl,(uchar *)hash_00);
    iVar17 = mbedtls_ssl_read_record(ssl);
    if (iVar17 != 0) {
      pcVar44 = "mbedtls_ssl_read_record";
      iVar16 = 0xd4f;
      goto LAB_0016dd5a;
    }
    ssl->state = ssl->state + 1;
    if ((ssl->in_msgtype != 0x16) || (*ssl->in_msg != '\x0f')) {
      pcVar44 = "bad certificate verify message";
      iVar17 = 0xd58;
      goto LAB_0016e657;
    }
    lVar37 = (ulong)((ssl->conf->field_0x164 & 2) >> 1) * 8;
    uVar53 = lVar37 + 4;
    if (ssl->minor_ver == 3) {
      if (ssl->in_hslen < (uVar53 | 2)) {
        pcVar44 = "bad certificate verify message";
        iVar17 = 0xd7c;
        goto LAB_0016e657;
      }
      bVar12 = ssl->in_msg[uVar53];
      if (ssl->handshake->verify_sig_alg != (uint)bVar12) {
        pcVar44 = "peer not adhering to requested sig_alg for verify message";
        iVar17 = 0xd86;
        goto LAB_0016e657;
      }
      mVar20 = mbedtls_ssl_md_alg_from_hash(bVar12);
      mVar21 = mbedtls_ssl_pk_alg_from_sig(ssl->in_msg[lVar37 + 5]);
      if (mVar21 == MBEDTLS_PK_NONE) {
        pcVar44 = "peer not adhering to requested sig_alg for verify message";
        iVar17 = 0xd98;
        goto LAB_0016e657;
      }
      iVar17 = mbedtls_pk_can_do(&ssl->session_negotiate->peer_cert->pk,mVar21);
      if (iVar17 == 0) {
        pcVar44 = "sig_alg doesn\'t match cert key";
        iVar17 = 0xda1;
        goto LAB_0016e657;
      }
      sVar31 = 0;
      uVar53 = uVar53 | 2;
    }
    else {
      mVar20 = MBEDTLS_MD_SHA1;
      iVar17 = mbedtls_pk_can_do(&ssl->session_negotiate->peer_cert->pk,MBEDTLS_PK_ECDSA);
      if (iVar17 == 0) {
        mVar20 = MBEDTLS_MD_NONE;
        sVar31 = 0x24;
      }
      else {
        sVar31 = 0x14;
        hash_00 = (mbedtls_sha1_context *)(mbedtls_sha1.state + 2);
      }
    }
    uVar35 = uVar53 + 2;
    if (ssl->in_hslen < uVar35) {
      pcVar44 = "bad certificate verify message";
      iVar17 = 0xdb0;
    }
    else {
      uVar14 = *(ushort *)(ssl->in_msg + uVar53);
      uVar53 = (ulong)(ushort)(uVar14 << 8 | uVar14 >> 8);
      if (uVar53 + uVar35 == ssl->in_hslen) {
        iVar17 = mbedtls_pk_verify(&ssl->session_negotiate->peer_cert->pk,mVar20,(uchar *)hash_00,
                                   sVar31,ssl->in_msg + uVar35,uVar53);
        if (iVar17 != 0) {
          pcVar44 = "mbedtls_pk_verify";
          iVar16 = 0xdc1;
          goto LAB_0016dd5a;
        }
        pcVar44 = "<= parse certificate verify";
        iVar17 = 0;
        iVar16 = 2;
        line = 0xdc5;
        goto LAB_0016e178;
      }
      pcVar44 = "bad certificate verify message";
      iVar17 = 0xdb9;
    }
LAB_0016e657:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,iVar17,pcVar44);
    return -0x7d80;
  case 10:
    iVar17 = mbedtls_ssl_parse_change_cipher_spec(ssl);
    return iVar17;
  case 0xb:
    iVar17 = mbedtls_ssl_parse_finished(ssl);
    return iVar17;
  case 0xc:
    if (ssl->handshake->new_session_ticket == 0) {
      iVar17 = mbedtls_ssl_write_change_cipher_spec(ssl);
      return iVar17;
    }
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0xdd4,"=> write new session ticket");
    ssl->out_msgtype = 0x16;
    *ssl->out_msg = '\x04';
    iVar17 = (*ssl->conf->f_ticket_write)
                       (ssl->conf->p_ticket,ssl->session_negotiate,ssl->out_msg + 10,
                        ssl->out_msg + 0x4000,(size_t *)&mbedtls_sha1,mbedtls_md5.total);
    if (iVar17 != 0) {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0xdea,"mbedtls_ssl_ticket_write",iVar17);
      mbedtls_sha1.total[0] = 0;
      mbedtls_sha1.total[1] = 0;
    }
    ssl->out_msg[4] = (uchar)(mbedtls_md5.total[0] >> 0x18);
    ssl->out_msg[5] = (uchar)(mbedtls_md5.total[0] >> 0x10);
    ssl->out_msg[6] = (uchar)(mbedtls_md5.total[0] >> 8);
    ssl->out_msg[7] = (uchar)mbedtls_md5.total[0];
    ssl->out_msg[8] = mbedtls_sha1.total[0]._1_1_;
    ssl->out_msg[9] = (uchar)mbedtls_sha1.total[0];
    ssl->out_msglen = (long)mbedtls_sha1.total + 10;
    ssl->handshake->new_session_ticket = 0;
    iVar17 = mbedtls_ssl_write_record(ssl);
    if (iVar17 != 0) {
      pcVar44 = "mbedtls_ssl_write_record";
      iVar16 = 0xe00;
      goto LAB_0016dd5a;
    }
    pcVar44 = "<= write new session ticket";
    iVar16 = 2;
    line = 0xe04;
    iVar17 = 0;
    goto LAB_0016e178;
  case 0xd:
    iVar17 = mbedtls_ssl_write_finished(ssl);
    return iVar17;
  case 0xe:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0xe7d,"handshake: done");
    ssl->state = 0xf;
    return 0;
  case 0xf:
    mbedtls_ssl_handshake_wrapup(ssl);
    return 0;
  default:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0xe86,"invalid state %d");
    return -0x7100;
  case 0x12:
    return -0x6a80;
  }
  auVar48 = (uint32_t  [2])((long)puVar52 + ssl->in_hslen);
  switch(pmVar27->key_exchange) {
  case MBEDTLS_KEY_EXCHANGE_RSA:
    iVar17 = ssl_parse_encrypted_pms(ssl,(uchar *)mbedtls_sha1.total,(uchar *)auVar48,0);
    if (iVar17 != 0) {
      pcVar44 = "ssl_parse_parse_encrypted_pms_secret";
      iVar16 = 0xd00;
      goto LAB_0016dd5a;
    }
    break;
  case MBEDTLS_KEY_EXCHANGE_DHE_RSA:
    iVar17 = ssl_parse_client_dh_public(ssl,(uchar **)&mbedtls_sha1,(uchar *)auVar48);
    if (iVar17 != 0) {
      pcVar44 = "ssl_parse_client_dh_public";
      iVar16 = 0xc58;
      goto LAB_0016dd5a;
    }
    if (mbedtls_sha1.total != auVar48) {
      pcVar44 = "bad client key exchange";
      iVar17 = 0xc5e;
      goto LAB_0016e62c;
    }
    pmVar29 = ssl->handshake;
    iVar17 = mbedtls_dhm_calc_secret
                       (&pmVar29->dhm_ctx,pmVar29->premaster,0x424,&pmVar29->pmslen,ssl->conf->f_rng
                        ,ssl->conf->p_rng);
    if (iVar17 != 0) {
      pcVar44 = "mbedtls_dhm_calc_secret";
      iVar16 = 0xc68;
      goto LAB_0016eeb1;
    }
    X = &(ssl->handshake->dhm_ctx).K;
    pcVar44 = "DHM: K ";
    iVar17 = 0xc6c;
    goto LAB_0016f622;
  default:
    iVar17 = mbedtls_ecdh_read_public
                       (&ssl->handshake->ecdh_ctx,(uchar *)mbedtls_sha1.total,
                        ssl->in_hslen - (uVar53 * 4 + 4));
    if (iVar17 != 0) {
      iVar16 = 0xc7c;
LAB_0016e03c:
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,iVar16,"mbedtls_ecdh_read_public",iVar17);
      return -0x7c80;
    }
    mbedtls_debug_print_ecp
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0xc80,"ECDH: Qp ",&(ssl->handshake->ecdh_ctx).Qp);
    pmVar29 = ssl->handshake;
    iVar17 = mbedtls_ecdh_calc_secret
                       (&pmVar29->ecdh_ctx,&pmVar29->pmslen,pmVar29->premaster,0x400,
                        ssl->conf->f_rng,ssl->conf->p_rng);
    if (iVar17 != 0) {
      pcVar44 = "mbedtls_ecdh_calc_secret";
      iVar16 = 0xc88;
LAB_0016eeb1:
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,iVar16,pcVar44,iVar17);
      return -32000;
    }
    X = &(ssl->handshake->ecdh_ctx).z;
    pcVar44 = "ECDH: z  ";
    iVar17 = 0xc8c;
LAB_0016f622:
    mbedtls_debug_print_mpi
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,iVar17,pcVar44,X);
    break;
  case MBEDTLS_KEY_EXCHANGE_PSK:
    iVar17 = ssl_parse_client_psk_identity(ssl,(uchar **)&mbedtls_sha1,(uchar *)auVar48);
    if (iVar17 != 0) {
      pcVar44 = "ssl_parse_client_psk_identity";
      iVar16 = 0xc98;
      goto LAB_0016dd5a;
    }
    if (mbedtls_sha1.total != auVar48) {
      pcVar44 = "bad client key exchange";
      iVar17 = 0xc9e;
      goto LAB_0016e62c;
    }
    iVar17 = mbedtls_ssl_psk_derive_premaster(ssl,pmVar27->key_exchange);
    if (iVar17 != 0) {
      pcVar44 = "mbedtls_ssl_psk_derive_premaster";
      iVar16 = 0xca5;
      goto LAB_0016dd5a;
    }
    break;
  case MBEDTLS_KEY_EXCHANGE_DHE_PSK:
    iVar17 = ssl_parse_client_psk_identity(ssl,(uchar **)&mbedtls_sha1,(uchar *)auVar48);
    if (iVar17 != 0) {
      pcVar44 = "ssl_parse_client_psk_identity";
      iVar16 = 0xcc8;
      goto LAB_0016dd5a;
    }
    iVar17 = ssl_parse_client_dh_public(ssl,(uchar **)&mbedtls_sha1,(uchar *)auVar48);
    if (iVar17 != 0) {
      pcVar44 = "ssl_parse_client_dh_public";
      iVar16 = 0xccd;
      goto LAB_0016dd5a;
    }
    if (mbedtls_sha1.total != auVar48) {
      pcVar44 = "bad client key exchange";
      iVar17 = 0xcd3;
      goto LAB_0016e62c;
    }
    iVar17 = mbedtls_ssl_psk_derive_premaster(ssl,pmVar27->key_exchange);
    if (iVar17 != 0) {
      pcVar44 = "mbedtls_ssl_psk_derive_premaster";
      iVar16 = 0xcda;
      goto LAB_0016dd5a;
    }
    break;
  case MBEDTLS_KEY_EXCHANGE_RSA_PSK:
    iVar17 = ssl_parse_client_psk_identity(ssl,(uchar **)&mbedtls_sha1,(uchar *)auVar48);
    if (iVar17 != 0) {
      pcVar44 = "ssl_parse_client_psk_identity";
      iVar16 = 0xcb0;
      goto LAB_0016dd5a;
    }
    iVar17 = ssl_parse_encrypted_pms(ssl,(uchar *)mbedtls_sha1.total,(uchar *)auVar48,2);
    if (iVar17 != 0) {
      pcVar44 = "ssl_parse_encrypted_pms";
      iVar16 = 0xcb6;
      goto LAB_0016dd5a;
    }
    iVar17 = mbedtls_ssl_psk_derive_premaster(ssl,pmVar27->key_exchange);
    if (iVar17 != 0) {
      pcVar44 = "mbedtls_ssl_psk_derive_premaster";
      iVar16 = 0xcbd;
      goto LAB_0016dd5a;
    }
    break;
  case MBEDTLS_KEY_EXCHANGE_ECDHE_PSK:
    iVar17 = ssl_parse_client_psk_identity(ssl,(uchar **)&mbedtls_sha1,(uchar *)auVar48);
    if (iVar17 != 0) {
      pcVar44 = "ssl_parse_client_psk_identity";
      iVar16 = 0xce5;
      goto LAB_0016dd5a;
    }
    iVar17 = mbedtls_ecdh_read_public
                       (&ssl->handshake->ecdh_ctx,(uchar *)mbedtls_sha1.total,
                        (long)auVar48 - (long)mbedtls_sha1.total);
    if (iVar17 != 0) {
      iVar16 = 0xcec;
      goto LAB_0016e03c;
    }
    mbedtls_debug_print_ecp
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0xcf0,"ECDH: Qp ",&(ssl->handshake->ecdh_ctx).Qp);
    iVar17 = mbedtls_ssl_psk_derive_premaster(ssl,pmVar27->key_exchange);
    if (iVar17 != 0) {
      pcVar44 = "mbedtls_ssl_psk_derive_premaster";
      iVar16 = 0xcf5;
      goto LAB_0016dd5a;
    }
  }
  iVar17 = mbedtls_ssl_derive_keys(ssl);
  if (iVar17 != 0) {
    pcVar44 = "mbedtls_ssl_derive_keys";
    iVar16 = 0xd0d;
LAB_0016dd5a:
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,iVar16,pcVar44,iVar17);
    return iVar17;
  }
  ssl->state = ssl->state + 1;
  pcVar44 = "<= parse client key exchange";
  iVar17 = 0;
  iVar16 = 2;
  line = 0xd13;
LAB_0016e178:
  mbedtls_debug_print_msg
            (ssl,iVar16,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
             ,line,pcVar44);
  return iVar17;
LAB_0017099b:
  if (uVar38 <= uVar53) goto LAB_00170a73;
  if ((pbVar47[uVar53 + uVar35 + lVar37 + 0x29] == 0x56) &&
     (pbVar47[uVar53 + uVar35 + lVar37 + 0x2a] == 0)) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x66c,"received FALLBACK_SCSV");
    if (ssl->minor_ver < (int)(uint)ssl->conf->max_minor_ver) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x670,"inapropriate fallback");
      uVar13 = 'V';
LAB_00170a65:
      mbedtls_ssl_send_alert_message(ssl,'\x02',uVar13);
      return -0x7900;
    }
    goto LAB_00170a73;
  }
  uVar53 = uVar53 + 2;
  goto LAB_0017099b;
LAB_00170a73:
  for (uVar53 = 0; uVar53 < uVar38; uVar53 = uVar53 + 2) {
    if ((pbVar47[uVar53 + (long)local_1e0 + lVar37 + 2] == 0) &&
       (pbVar47[uVar53 + (long)local_1e0 + lVar37 + 3] == 0xff)) {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x684,"received TLS_EMPTY_RENEGOTIATION_INFO ");
      if (ssl->renego_status != 1) {
        ssl->secure_renegotiation = 1;
        goto LAB_00170bd8;
      }
      pcVar44 = "received RENEGOTIATION SCSV during renegotiation";
      iVar17 = 0x688;
      goto LAB_001711fa;
    }
  }
  iVar17 = ssl->secure_renegotiation;
  if ((iVar17 == 1) || ((*(uint *)&ssl->conf->field_0x164 & 0x30) != 0x20)) {
    if (ssl->renego_status != 1) {
LAB_00170bd8:
      pmVar36 = ssl->conf;
LAB_00170bdb:
      piVar5 = pmVar36->ciphersuite_list[*minor];
      local_1f0 = (uchar *)0x0;
      bVar10 = false;
      do {
        if (piVar5[(long)local_1f0] == 0) {
          if (bVar10) {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                       ,0x6e2,"got ciphersuites in common, but none of them usable");
            mbedtls_ssl_send_fatal_handshake_failure(ssl);
            return -0x6980;
          }
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                     ,0x6e8,"got no ciphersuites in common");
          mbedtls_ssl_send_fatal_handshake_failure(ssl);
          return -0x7380;
        }
        pbVar47 = local_178;
        for (uVar53 = 0; uVar53 < uVar38; uVar53 = uVar53 + 2) {
          iVar17 = piVar5[(long)local_1f0];
          if ((*pbVar47 == (byte)((uint)iVar17 >> 8)) && (pbVar47[1] == (byte)iVar17)) {
            pmVar27 = mbedtls_ssl_ciphersuite_from_id(iVar17);
            if (pmVar27 == (mbedtls_ssl_ciphersuite_t *)0x0) {
              pcVar44 = "should never happen";
              iVar17 = 0x2aa;
              goto LAB_0016e541;
            }
            mbedtls_debug_print_msg
                      (ssl,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                       ,0x2ae,"trying ciphersuite: %s",pmVar27->name);
            if ((ssl->minor_ver < pmVar27->min_minor_ver) ||
               (pmVar27->max_minor_ver < ssl->minor_ver)) {
              iVar17 = 0x2b3;
              pcVar44 = "ciphersuite mismatch: version";
            }
            else {
              uVar18 = *(uint *)&ssl->conf->field_0x164;
              if (((uVar18 & 2) != 0) && (bVar10 = true, (pmVar27->flags & 4) != 0))
              goto LAB_00170c9b;
              if (((uVar18 & 0x40) == 0) || (pmVar27->cipher != MBEDTLS_CIPHER_ARC4_128)) {
                iVar17 = mbedtls_ssl_ciphersuite_uses_ec(pmVar27);
                if ((iVar17 == 0) ||
                   ((ppmVar33 = ssl->handshake->curves, ppmVar33 != (mbedtls_ecp_curve_info **)0x0
                    && (*ppmVar33 != (mbedtls_ecp_curve_info *)0x0)))) {
                  iVar17 = mbedtls_ssl_ciphersuite_uses_psk(pmVar27);
                  if (((iVar17 == 0) ||
                      (pmVar36 = ssl->conf,
                      pmVar36->f_psk !=
                      (_func_int_void_ptr_mbedtls_ssl_context_ptr_uchar_ptr_size_t *)0x0)) ||
                     ((((pmVar36->psk != (uchar *)0x0 && (pmVar36->psk_identity != (uchar *)0x0)) &&
                       (pmVar36->psk_identity_len != 0)) && (pmVar36->psk_len != 0)))) {
                    mVar21 = mbedtls_ssl_get_ciphersuite_sig_pk_alg(pmVar27);
                    pmVar43 = ssl->handshake->sni_key_cert;
                    if (pmVar43 == (mbedtls_ssl_key_cert *)0x0) {
                      pmVar43 = ssl->conf->key_cert;
                    }
                    if (mVar21 == MBEDTLS_PK_NONE) {
LAB_0017111b:
                      iVar17 = 0;
                      mbedtls_debug_print_msg
                                (ssl,2,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                                 ,0x6ee,"selected ciphersuite: %s",pmVar27->name);
                      ssl->session_negotiate->ciphersuite = piVar5[(long)local_1f0];
                      ssl->transform_negotiate->ciphersuite_info = pmVar27;
                      mbedtls_ssl_optimize_checksum(ssl,pmVar27);
                      ssl->state = ssl->state + 1;
                      if ((ssl->conf->field_0x164 & 2) != 0) {
                        mbedtls_ssl_recv_flight_completed(ssl);
                      }
                      pcVar44 = "<= parse client hello";
                      iVar16 = 2;
                      line = 0x6fb;
                      goto LAB_0016e178;
                    }
                    mbedtls_debug_print_msg
                              (ssl,3,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                               ,0x24d,"ciphersuite requires certificate");
                    if (pmVar43 == (mbedtls_ssl_key_cert *)0x0) {
                      mbedtls_debug_print_msg
                                (ssl,3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                                 ,0x251,"server has no certificate");
                    }
                    else {
                      local_1e0 = (mbedtls_ssl_key_cert *)0x0;
                      for (; pmVar11 = local_1e0, pmVar43 != (mbedtls_ssl_key_cert *)0x0;
                          pmVar43 = pmVar43->next) {
                        mbedtls_debug_print_crt
                                  (ssl,3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                                   ,600,"candidate certificate chain, certificate",pmVar43->cert);
                        iVar17 = mbedtls_pk_can_do(pmVar43->key,mVar21);
                        if (iVar17 == 0) {
                          iVar17 = 0x25c;
                          pcVar44 = "certificate mismatch: key type";
                        }
                        else {
                          iVar17 = mbedtls_ssl_check_cert_usage
                                             (pmVar43->cert,pmVar27,1,mbedtls_sha1.total);
                          if (iVar17 == 0) {
                            if (mVar21 == MBEDTLS_PK_ECDSA) {
                              ppmVar33 = ssl->handshake->curves;
                              do {
                                pmVar34 = *ppmVar33;
                                if (pmVar34 == (mbedtls_ecp_curve_info *)0x0) {
                                  iVar17 = 0x274;
                                  pcVar44 = "certificate mismatch: elliptic curve";
                                  goto LAB_00170eb4;
                                }
                                ppmVar33 = ppmVar33 + 1;
                              } while (pmVar34->grp_id != *pmVar43->key->pk_ctx);
                            }
                            pmVar11 = pmVar43;
                            if (2 < *minor) break;
                            pmVar39 = pmVar43->cert;
                            if (pmVar39->sig_md == MBEDTLS_MD_SHA1) goto LAB_001710ed;
                            if (local_1e0 == (mbedtls_ssl_key_cert *)0x0) {
                              local_1e0 = pmVar43;
                            }
                            iVar17 = 0x285;
                            pcVar44 = "certificate not preferred: sha-2 with pre-TLS 1.2 client";
                          }
                          else {
                            iVar17 = 0x26c;
                            pcVar44 = "certificate mismatch: (extended) key usage extension";
                          }
                        }
LAB_00170eb4:
                        mbedtls_debug_print_msg
                                  (ssl,3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                                   ,iVar17,pcVar44);
                      }
                      local_1e0 = pmVar11;
                      if (local_1e0 != (mbedtls_ssl_key_cert *)0x0) {
                        pmVar39 = local_1e0->cert;
                        pmVar43 = local_1e0;
LAB_001710ed:
                        local_1e0 = pmVar43;
                        ssl->handshake->key_cert = local_1e0;
                        mbedtls_debug_print_crt
                                  (ssl,3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                                   ,0x296,"selected certificate chain, certificate",pmVar39);
                        goto LAB_0017111b;
                      }
                    }
                    iVar17 = 0x2e9;
                    pcVar44 = "ciphersuite mismatch: no suitable certificate";
                  }
                  else {
                    iVar17 = 0x2d9;
                    pcVar44 = "ciphersuite mismatch: no pre-shared key";
                  }
                }
                else {
                  iVar17 = 0x2cc;
                  pcVar44 = "ciphersuite mismatch: no common elliptic curve";
                }
              }
              else {
                iVar17 = 0x2c1;
                pcVar44 = "ciphersuite mismatch: rc4";
              }
            }
            mbedtls_debug_print_msg
                      (ssl,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                       ,iVar17,pcVar44);
            bVar10 = true;
          }
LAB_00170c9b:
          pbVar47 = pbVar47 + 2;
        }
        local_1f0 = (uchar *)((long)local_1f0 + 1);
      } while( true );
    }
    if (iVar17 == 1 && !bVar10) {
      pcVar44 = "renegotiation_info extension missing (secure)";
      iVar17 = 0x6a3;
    }
    else {
      pmVar36 = ssl->conf;
      if (iVar17 != 0) goto LAB_00170bdb;
      if ((pmVar36->field_0x164 & 0x30) == 0) {
        pcVar44 = "legacy renegotiation not allowed";
        iVar17 = 0x6aa;
      }
      else {
        if (!bVar10) goto LAB_00170bdb;
        pcVar44 = "renegotiation_info extension present (legacy)";
        iVar17 = 0x6b1;
      }
    }
  }
  else {
    pcVar44 = "legacy renegotiation, breaking off handshake";
    iVar17 = 0x69b;
  }
LAB_001711fa:
  mbedtls_debug_print_msg
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
             ,iVar17,pcVar44);
  iVar17 = mbedtls_ssl_send_fatal_handshake_failure(ssl);
  if (iVar17 == 0) {
    return -0x7900;
  }
  return iVar17;
}

Assistant:

int mbedtls_ssl_handshake_server_step( mbedtls_ssl_context *ssl )
{
    int ret = 0;

    if( ssl->state == MBEDTLS_SSL_HANDSHAKE_OVER || ssl->handshake == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "server state: %d", ssl->state ) );

    if( ( ret = mbedtls_ssl_flush_output( ssl ) ) != 0 )
        return( ret );

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake->retransmit_state == MBEDTLS_SSL_RETRANS_SENDING )
    {
        if( ( ret = mbedtls_ssl_resend( ssl ) ) != 0 )
            return( ret );
    }
#endif

    switch( ssl->state )
    {
        case MBEDTLS_SSL_HELLO_REQUEST:
            ssl->state = MBEDTLS_SSL_CLIENT_HELLO;
            break;

        /*
         *  <==   ClientHello
         */
        case MBEDTLS_SSL_CLIENT_HELLO:
            ret = ssl_parse_client_hello( ssl );
            break;

#if defined(MBEDTLS_SSL_PROTO_DTLS)
        case MBEDTLS_SSL_SERVER_HELLO_VERIFY_REQUEST_SENT:
            return( MBEDTLS_ERR_SSL_HELLO_VERIFY_REQUIRED );
#endif

        /*
         *  ==>   ServerHello
         *        Certificate
         *      ( ServerKeyExchange  )
         *      ( CertificateRequest )
         *        ServerHelloDone
         */
        case MBEDTLS_SSL_SERVER_HELLO:
            ret = ssl_write_server_hello( ssl );
            break;

        case MBEDTLS_SSL_SERVER_CERTIFICATE:
            ret = mbedtls_ssl_write_certificate( ssl );
            break;

        case MBEDTLS_SSL_SERVER_KEY_EXCHANGE:
            ret = ssl_write_server_key_exchange( ssl );
            break;

        case MBEDTLS_SSL_CERTIFICATE_REQUEST:
            ret = ssl_write_certificate_request( ssl );
            break;

        case MBEDTLS_SSL_SERVER_HELLO_DONE:
            ret = ssl_write_server_hello_done( ssl );
            break;

        /*
         *  <== ( Certificate/Alert  )
         *        ClientKeyExchange
         *      ( CertificateVerify  )
         *        ChangeCipherSpec
         *        Finished
         */
        case MBEDTLS_SSL_CLIENT_CERTIFICATE:
            ret = mbedtls_ssl_parse_certificate( ssl );
            break;

        case MBEDTLS_SSL_CLIENT_KEY_EXCHANGE:
            ret = ssl_parse_client_key_exchange( ssl );
            break;

        case MBEDTLS_SSL_CERTIFICATE_VERIFY:
            ret = ssl_parse_certificate_verify( ssl );
            break;

        case MBEDTLS_SSL_CLIENT_CHANGE_CIPHER_SPEC:
            ret = mbedtls_ssl_parse_change_cipher_spec( ssl );
            break;

        case MBEDTLS_SSL_CLIENT_FINISHED:
            ret = mbedtls_ssl_parse_finished( ssl );
            break;

        /*
         *  ==> ( NewSessionTicket )
         *        ChangeCipherSpec
         *        Finished
         */
        case MBEDTLS_SSL_SERVER_CHANGE_CIPHER_SPEC:
#if defined(MBEDTLS_SSL_SESSION_TICKETS)
            if( ssl->handshake->new_session_ticket != 0 )
                ret = ssl_write_new_session_ticket( ssl );
            else
#endif
                ret = mbedtls_ssl_write_change_cipher_spec( ssl );
            break;

        case MBEDTLS_SSL_SERVER_FINISHED:
            ret = mbedtls_ssl_write_finished( ssl );
            break;

        case MBEDTLS_SSL_FLUSH_BUFFERS:
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "handshake: done" ) );
            ssl->state = MBEDTLS_SSL_HANDSHAKE_WRAPUP;
            break;

        case MBEDTLS_SSL_HANDSHAKE_WRAPUP:
            mbedtls_ssl_handshake_wrapup( ssl );
            break;

        default:
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "invalid state %d", ssl->state ) );
            return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    return( ret );
}